

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

int poll(pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  mapped_type *pmVar2;
  pointer ppVar3;
  stCoEpoll_t *psVar4;
  iterator iStack_b8;
  int j_1;
  _Base_ptr local_b0;
  ulong local_a8;
  size_t i_1;
  int ret;
  int j;
  _Base_ptr local_80;
  ulong local_78;
  size_t i;
  iterator it;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> m;
  nfds_t nfds_merge;
  pollfd *fds_merge;
  int timeout_local;
  nfds_t nfds_local;
  pollfd *fds_local;
  
  if (g_sys_poll_func == (poll_pfn_t)0x0) {
    g_sys_poll_func = (poll_pfn_t)dlsym(0xffffffffffffffff,"poll");
  }
  bVar1 = co_is_enable_sys_hook();
  if ((bVar1) && (__timeout != 0)) {
    nfds_merge = 0;
    m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&it);
    std::_Rb_tree_iterator<std::pair<const_int,_int>_>::_Rb_tree_iterator
              ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&i);
    if (1 < __nfds) {
      nfds_merge = (nfds_t)malloc(__nfds << 3);
      for (local_78 = 0; local_78 < __nfds; local_78 = local_78 + 1) {
        local_80 = (_Base_ptr)
                   std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   find((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&it,&__fds[local_78].fd);
        i = (size_t)local_80;
        _ret = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                         ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&it);
        bVar1 = std::operator==((_Self *)&i,(_Self *)&ret);
        if (bVar1) {
          *(pollfd *)(nfds_merge + m._M_t._M_impl.super__Rb_tree_header._M_node_count * 8) =
               __fds[local_78];
          pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&it,&__fds[local_78].fd);
          *pmVar2 = (mapped_type)m._M_t._M_impl.super__Rb_tree_header._M_node_count;
          m._M_t._M_impl.super__Rb_tree_header._M_node_count =
               m._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
        }
        else {
          ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&i);
          i_1._4_4_ = ppVar3->second;
          *(ushort *)(nfds_merge + (long)i_1._4_4_ * 8 + 4) =
               *(ushort *)(nfds_merge + (long)i_1._4_4_ * 8 + 4) | __fds[local_78].events;
        }
      }
    }
    i_1._0_4_ = 0;
    if ((m._M_t._M_impl.super__Rb_tree_header._M_node_count == __nfds) || (__nfds == 1)) {
      psVar4 = co_get_epoll_ct();
      i_1._0_4_ = co_poll_inner(psVar4,(pollfd *)__fds,__nfds,__timeout,g_sys_poll_func);
    }
    else {
      psVar4 = co_get_epoll_ct();
      i_1._0_4_ = co_poll_inner(psVar4,(pollfd *)nfds_merge,
                                m._M_t._M_impl.super__Rb_tree_header._M_node_count,__timeout,
                                g_sys_poll_func);
      if (0 < (int)i_1) {
        for (local_a8 = 0; local_a8 < __nfds; local_a8 = local_a8 + 1) {
          local_b0 = (_Base_ptr)
                     std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::find((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&it,&__fds[local_a8].fd);
          i = (size_t)local_b0;
          iStack_b8 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      end((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&it);
          bVar1 = std::operator!=((_Self *)&i,&stack0xffffffffffffff48);
          if (bVar1) {
            ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&i);
            __fds[local_a8].revents =
                 *(ushort *)(nfds_merge + 6 + (long)ppVar3->second * 8) & __fds[local_a8].events;
          }
        }
      }
    }
    free((void *)nfds_merge);
    fds_local._4_4_ = (int)i_1;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&it);
  }
  else {
    fds_local._4_4_ = (*g_sys_poll_func)((pollfd *)__fds,__nfds,__timeout);
  }
  return fds_local._4_4_;
}

Assistant:

int poll(struct pollfd fds[], nfds_t nfds, int timeout)
{
	HOOK_SYS_FUNC( poll );

	if (!co_is_enable_sys_hook() || timeout == 0) {
		return g_sys_poll_func(fds, nfds, timeout);
	}
	pollfd *fds_merge = NULL;
	nfds_t nfds_merge = 0;
	std::map<int, int> m;  // fd --> idx
	std::map<int, int>::iterator it;
	if (nfds > 1) {
		fds_merge = (pollfd *)malloc(sizeof(pollfd) * nfds);
		for (size_t i = 0; i < nfds; i++) {
			if ((it = m.find(fds[i].fd)) == m.end()) {
				fds_merge[nfds_merge] = fds[i];
				m[fds[i].fd] = nfds_merge;
				nfds_merge++;
			} else {
				int j = it->second;
				fds_merge[j].events |= fds[i].events;  // merge in j slot
			}
		}
	}

	int ret = 0;
	if (nfds_merge == nfds || nfds == 1) {
		ret = co_poll_inner(co_get_epoll_ct(), fds, nfds, timeout, g_sys_poll_func);
	} else {
		ret = co_poll_inner(co_get_epoll_ct(), fds_merge, nfds_merge, timeout,
				g_sys_poll_func);
		if (ret > 0) {
			for (size_t i = 0; i < nfds; i++) {
				it = m.find(fds[i].fd);
				if (it != m.end()) {
					int j = it->second;
					fds[i].revents = fds_merge[j].revents & fds[i].events;
				}
			}
		}
	}
	free(fds_merge);
	return ret;


}